

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
::write_compact_float
          (binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
           *this,number_float_t n,input_format_t format)

{
  char cVar1;
  element_type *peVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int in_ESI;
  float fVar4;
  binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
  *in_XMM0_Qa;
  char local_49;
  undefined8 in_stack_ffffffffffffffb8;
  float n_00;
  undefined7 in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
  *in_stack_ffffffffffffffd0;
  
  n_00 = (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  fVar4 = std::numeric_limits<float>::lowest();
  if (((double)fVar4 <= (double)in_XMM0_Qa) &&
     (in_stack_ffffffffffffffd0 = in_XMM0_Qa, fVar4 = std::numeric_limits<float>::max(),
     (double)in_stack_ffffffffffffffd0 <= (double)fVar4)) {
    if (((double)(float)(double)in_XMM0_Qa == (double)in_XMM0_Qa) &&
       (!NAN((double)(float)(double)in_XMM0_Qa) && !NAN((double)in_XMM0_Qa))) {
      peVar2 = std::
               __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xdfe8c0);
      if (in_ESI == 1) {
        cVar1 = get_cbor_float_prefix(0.0);
        uVar3 = extraout_RDX;
      }
      else {
        cVar1 = get_msgpack_float_prefix(0.0);
        uVar3 = extraout_RDX_00;
      }
      (**peVar2->_vptr_output_adapter_protocol)(peVar2,(ulong)(uint)(int)cVar1,uVar3,cVar1);
      binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,char>
      ::write_number<float,false>
                ((binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
                  *)CONCAT17(cVar1,in_stack_ffffffffffffffc0),n_00);
      return;
    }
  }
  peVar2 = std::
           __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xdfe929);
  if (in_ESI == 1) {
    local_49 = get_cbor_float_prefix(7.25003786282945e-317);
    uVar3 = extraout_RDX_01;
  }
  else {
    local_49 = get_msgpack_float_prefix(7.25004626194543e-317);
    uVar3 = extraout_RDX_02;
  }
  (**peVar2->_vptr_output_adapter_protocol)(peVar2,(ulong)(uint)(int)local_49,uVar3,local_49);
  binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,char>
  ::write_number<double,false>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void write_compact_float(const number_float_t n, detail::input_format_t format)
    {
#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wfloat-equal"
#endif
        if (static_cast<double>(n) >= static_cast<double>(std::numeric_limits<float>::lowest()) &&
                static_cast<double>(n) <= static_cast<double>((std::numeric_limits<float>::max)()) &&
                static_cast<double>(static_cast<float>(n)) == static_cast<double>(n))
        {
            oa->write_character(format == detail::input_format_t::cbor
                                ? get_cbor_float_prefix(static_cast<float>(n))
                                : get_msgpack_float_prefix(static_cast<float>(n)));
            write_number(static_cast<float>(n));
        }
        else
        {
            oa->write_character(format == detail::input_format_t::cbor
                                ? get_cbor_float_prefix(n)
                                : get_msgpack_float_prefix(n));
            write_number(n);
        }
#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
    }